

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O0

void reoProfileWidthStart(reo_man *p)

{
  int *__s;
  int *__s_00;
  short *psVar1;
  uint local_2c;
  int v;
  int *pWidthStop;
  int *pWidthStart;
  reo_unit *pUnit;
  reo_man *p_local;
  
  __s = (int *)malloc((long)(p->nSupp + 1) << 2);
  __s_00 = (int *)malloc((long)(p->nSupp + 1) << 2);
  memset(__s,0,(long)(p->nSupp + 1) << 2);
  memset(__s_00,0,(long)(p->nSupp + 1) << 2);
  for (local_2c = 0; (int)local_2c <= p->nSupp; local_2c = local_2c + 1) {
    for (pWidthStart = (int *)p->pPlanes[(int)local_2c].pHead; pWidthStart != (int *)0x0;
        pWidthStart = *(int **)(pWidthStart + 8)) {
      *(undefined2 *)((long)pWidthStart + 2) = 30000;
      pWidthStart[2] = 0;
    }
  }
  for (local_2c = 0; (int)local_2c < p->nTops; local_2c = local_2c + 1) {
    psVar1 = (short *)((ulong)p->pTops[(int)local_2c] & 0xfffffffffffffffe);
    if (psVar1[1] == 30000) {
      psVar1[1] = 0;
      __s[psVar1[1]] = __s[psVar1[1]] + 1;
      if (*psVar1 != 30000) {
        __s_00[*psVar1 + 1] = __s_00[*psVar1 + 1] + 1;
      }
    }
  }
  for (local_2c = 0; (int)local_2c < p->nSupp; local_2c = local_2c + 1) {
    for (pWidthStart = (int *)p->pPlanes[(int)local_2c].pHead; pWidthStart != (int *)0x0;
        pWidthStart = *(int **)(pWidthStart + 8)) {
      if (*(short *)(*(long *)(pWidthStart + 4) + 2) == 30000) {
        *(short *)(*(long *)(pWidthStart + 4) + 2) = (short)*pWidthStart + 1;
        __s[*(short *)(*(long *)(pWidthStart + 4) + 2)] =
             __s[*(short *)(*(long *)(pWidthStart + 4) + 2)] + 1;
        if (**(short **)(pWidthStart + 4) != 30000) {
          __s_00[**(short **)(pWidthStart + 4) + 1] = __s_00[**(short **)(pWidthStart + 4) + 1] + 1;
        }
      }
      if (*(short *)(*(long *)(pWidthStart + 6) + 2) == 30000) {
        *(short *)(*(long *)(pWidthStart + 6) + 2) = (short)*pWidthStart + 1;
        __s[*(short *)(*(long *)(pWidthStart + 6) + 2)] =
             __s[*(short *)(*(long *)(pWidthStart + 6) + 2)] + 1;
        if (**(short **)(pWidthStart + 6) != 30000) {
          __s_00[**(short **)(pWidthStart + 6) + 1] = __s_00[**(short **)(pWidthStart + 6) + 1] + 1;
        }
      }
    }
  }
  for (local_2c = 0; (int)local_2c < p->nSupp; local_2c = local_2c + 1) {
    reoProfileWidthVerifyLevel(p->pPlanes + (int)local_2c,local_2c);
  }
  p->nWidthCur = 0;
  for (local_2c = 0; (int)local_2c <= p->nSupp; local_2c = local_2c + 1) {
    if (local_2c == 0) {
      p->pPlanes->statsWidth = *__s - *__s_00;
    }
    else {
      p->pPlanes[(int)local_2c].statsWidth =
           (p->pPlanes[(int)(local_2c - 1)].statsWidth + __s[(int)local_2c]) - __s_00[(int)local_2c]
      ;
    }
    p->pPlanes[(int)local_2c].statsCost = (double)p->pPlanes[(int)local_2c].statsWidth;
    p->nWidthCur = p->pPlanes[(int)local_2c].statsWidth + p->nWidthCur;
    printf("Level %2d: Width = %5d.\n",(ulong)local_2c,
           (ulong)(uint)p->pPlanes[(int)local_2c].statsWidth);
  }
  p->nWidthBeg = p->nWidthCur;
  if (__s != (int *)0x0) {
    free(__s);
  }
  if (__s_00 != (int *)0x0) {
    free(__s_00);
  }
  return;
}

Assistant:

void reoProfileWidthStart( reo_man * p )
{
    reo_unit * pUnit;
    int * pWidthStart;
    int * pWidthStop;
    int v;

    // allocate and clean the storage for starting and stopping levels
    pWidthStart = ABC_ALLOC( int, p->nSupp + 1 );
    pWidthStop  = ABC_ALLOC( int, p->nSupp + 1 );
    memset( pWidthStart, 0, sizeof(int) * (p->nSupp + 1) );
    memset( pWidthStop, 0, sizeof(int) * (p->nSupp + 1) );

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // add the topmost level of the width profile
    for ( v = 0; v < p->nTops; v++ )
    {
        pUnit = Unit_Regular(p->pTops[v]);
        if ( pUnit->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->TopRef = 0;
            pWidthStart[pUnit->TopRef]++;
            // set the stopping level
            if ( pUnit->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->lev+1]++;
        }
    }

    for ( v = 0; v < p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        if ( pUnit->pE->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pE->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pE->TopRef]++;
            // set the stopping level
            if ( pUnit->pE->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pE->lev+1]++;
        }
        if ( pUnit->pT->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pT->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pT->TopRef]++;
            // set the stopping level
            if ( pUnit->pT->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pT->lev+1]++;
        }
    }

    // verify the top reference
    for ( v = 0; v < p->nSupp; v++ )
        reoProfileWidthVerifyLevel( p->pPlanes + v, v );

    // derive the profile
    p->nWidthCur = 0;
    for ( v = 0; v <= p->nSupp; v++ )
    {
        if ( v == 0 )
            p->pPlanes[v].statsWidth = pWidthStart[v] - pWidthStop[v];
        else
            p->pPlanes[v].statsWidth = p->pPlanes[v-1].statsWidth + pWidthStart[v] - pWidthStop[v];
        p->pPlanes[v].statsCost = p->pPlanes[v].statsWidth;
        p->nWidthCur += p->pPlanes[v].statsWidth;
        printf( "Level %2d: Width = %5d.\n", v, p->pPlanes[v].statsWidth );
    }
    p->nWidthBeg = p->nWidthCur;
    ABC_FREE( pWidthStart );
    ABC_FREE( pWidthStop );
}